

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O1

void resetLocalOptions(vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records)

{
  HighsOptionType HVar1;
  OptionRecord *pOVar2;
  OptionRecordBool *option;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = (uint)((ulong)((long)(option_records->
                               super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(option_records->
                              super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      pOVar2 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)
               ._M_impl.super__Vector_impl_data._M_start[uVar4];
      HVar1 = pOVar2->type;
      if (HVar1 == kDouble) {
        *pOVar2[1]._vptr_OptionRecord = (_func_int *)pOVar2[1].name._M_string_length;
      }
      else if (HVar1 == kInt) {
        *(undefined4 *)pOVar2[1]._vptr_OptionRecord = *(undefined4 *)&pOVar2[1].field_0xc;
      }
      else if (HVar1 == kBool) {
        *(char *)pOVar2[1]._vptr_OptionRecord = (char)pOVar2[1].type;
      }
      else {
        std::__cxx11::string::_M_assign((string *)pOVar2[1]._vptr_OptionRecord);
      }
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar4);
  }
  return;
}

Assistant:

void reportOption(FILE* file, const HighsLogOptions& log_options,
                  const OptionRecordDouble& option,
                  const bool report_only_deviations,
                  const HighsFileType file_type) {
  if (!report_only_deviations || option.default_value != *option.value) {
    if (file_type == HighsFileType::kMd) {
      fprintf(
          file,
          "## %s\n- %s\n- Type: double\n- Range: [%g, %g]\n- Default: %g\n\n",
          highsInsertMdEscapes(option.name).c_str(),
          highsInsertMdEscapes(option.description).c_str(), option.lower_bound,
          option.upper_bound, option.default_value);
    } else if (file_type == HighsFileType::kFull) {
      fprintf(file, "\n# %s\n", option.description.c_str());
      fprintf(file,
              "# [type: double, advanced: %s, range: [%g, %g], default: %g]\n",
              highsBoolToString(option.advanced).c_str(), option.lower_bound,
              option.upper_bound, option.default_value);
      fprintf(file, "%s = %g\n", option.name.c_str(), *option.value);
    } else {
      std::string line = highsFormatToString(
          "Set option %s to %g\n", option.name.c_str(), *option.value);
      if (file == stdout) {
        highsLogUser(log_options, HighsLogType::kInfo, "%s", line.c_str());
      } else {
        fprintf(file, "%s", line.c_str());
      }
    }
  }
}